

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::update(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this,int p_col,
        number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *p_work,int *p_idx,int num)

{
  int iVar1;
  bool bVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  type_conflict5 tVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  long lVar11;
  long lVar12;
  long lVar13;
  longlong *plVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  uint *puVar17;
  multiprecision *pmVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  int32_t *piVar20;
  byte bVar21;
  cpp_dec_float<200U,_int,_void> local_2d8;
  pointer local_258;
  int *local_250;
  int *local_248;
  int *local_240;
  int *local_238;
  longlong local_230 [16];
  cpp_dec_float<200U,_int,_void> local_1b0;
  multiprecision local_130 [112];
  int local_c0;
  undefined1 local_bc;
  fpclass_type local_b8;
  int32_t local_b4;
  multiprecision local_b0 [112];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t local_34;
  
  bVar21 = 0;
  local_230[0xd] = 0;
  local_230[0xe] = 0;
  local_230[0xb] = 0;
  local_230[0xc] = 0;
  local_230[9] = 0;
  local_230[10] = 0;
  local_230[7] = 0;
  local_230[8] = 0;
  local_230[5] = 0;
  local_230[6] = 0;
  local_230[3] = 0;
  local_230[4] = 0;
  local_230[1] = 0;
  local_230[2] = 0;
  local_2d8.fpclass = cpp_dec_float_finite;
  local_2d8.prec_elem = 0x1c;
  local_2d8.data._M_elems[0] = 0;
  local_2d8.data._M_elems[1] = 0;
  local_2d8.data._M_elems[2] = 0;
  local_2d8.data._M_elems[3] = 0;
  local_2d8.data._M_elems[4] = 0;
  local_2d8.data._M_elems[5] = 0;
  local_2d8.data._M_elems[6] = 0;
  local_2d8.data._M_elems[7] = 0;
  local_2d8.data._M_elems[8] = 0;
  local_2d8.data._M_elems[9] = 0;
  local_2d8.data._M_elems[10] = 0;
  local_2d8.data._M_elems[0xb] = 0;
  local_2d8.data._M_elems[0xc] = 0;
  local_2d8.data._M_elems[0xd] = 0;
  local_2d8.data._M_elems[0xe] = 0;
  local_2d8.data._M_elems[0xf] = 0;
  local_2d8.data._M_elems[0x18] = 0;
  local_2d8.data._M_elems[0x19] = 0;
  local_2d8.data._M_elems._104_5_ = 0;
  local_2d8.data._M_elems[0x1b]._1_3_ = 0;
  local_2d8.exp = 0;
  local_2d8.neg = false;
  local_2d8.data._M_elems[0x10] = 0;
  local_2d8.data._M_elems[0x11] = 0;
  local_2d8.data._M_elems[0x12] = 0;
  local_2d8.data._M_elems[0x13] = 0;
  local_2d8.data._M_elems[0x14] = 0;
  local_2d8.data._M_elems[0x15] = 0;
  local_2d8.data._M_elems[0x16] = 0;
  local_2d8.data._M_elems[0x17] = 0;
  local_1b0.data._M_elems[0] = 1;
  local_1b0.data._M_elems[1] = 0;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
            (&local_2d8,(longlong *)&local_1b0,&p_work[p_col].m_backend);
  pcVar15 = &local_2d8;
  pcVar16 = &local_1b0;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pcVar16->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
    pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar21 * -8 + 4);
    pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar21 * -8 + 4);
  }
  local_1b0.exp = local_2d8.exp;
  local_1b0.neg = local_2d8.neg;
  local_1b0.fpclass = local_2d8.fpclass;
  local_1b0.prec_elem = local_2d8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&p_work[p_col].m_backend,0.0);
  iVar6 = makeLvec(this,num,p_col);
  local_258 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_250 = (this->l).idx;
  lVar12 = (long)iVar6;
  piVar20 = &local_258[lVar12 + 1].m_backend.prec_elem;
  local_248 = local_250 + lVar12;
  lVar13 = lVar12 << 0x20;
  local_238 = p_idx + num;
  lVar11 = 0;
  local_240 = p_idx;
  for (lVar8 = -4; piVar10 = local_250, iVar6 = *(int *)((long)local_238 + lVar8), iVar6 != p_col;
      lVar8 = lVar8 + -4) {
    local_248[lVar11] = iVar6;
    local_2d8.fpclass = cpp_dec_float_finite;
    local_2d8.prec_elem = 0x1c;
    local_2d8.data._M_elems[0] = 0;
    local_2d8.data._M_elems[1] = 0;
    local_2d8.data._M_elems[2] = 0;
    local_2d8.data._M_elems[3] = 0;
    local_2d8.data._M_elems[4] = 0;
    local_2d8.data._M_elems[5] = 0;
    local_2d8.data._M_elems[6] = 0;
    local_2d8.data._M_elems[7] = 0;
    local_2d8.data._M_elems[8] = 0;
    local_2d8.data._M_elems[9] = 0;
    local_2d8.data._M_elems[10] = 0;
    local_2d8.data._M_elems[0xb] = 0;
    local_2d8.data._M_elems[0xc] = 0;
    local_2d8.data._M_elems[0xd] = 0;
    local_2d8.data._M_elems[0xe] = 0;
    local_2d8.data._M_elems[0xf] = 0;
    local_2d8.data._M_elems[0x10] = 0;
    local_2d8.data._M_elems[0x11] = 0;
    local_2d8.data._M_elems[0x12] = 0;
    local_2d8.data._M_elems[0x13] = 0;
    local_2d8.data._M_elems[0x14] = 0;
    local_2d8.data._M_elems[0x15] = 0;
    local_2d8.data._M_elems[0x16] = 0;
    local_2d8.data._M_elems[0x17] = 0;
    local_2d8.data._M_elems[0x18] = 0;
    local_2d8.data._M_elems[0x19] = 0;
    local_2d8.data._M_elems._104_5_ = 0;
    local_2d8.data._M_elems[0x1b]._1_3_ = 0;
    local_2d8.exp = 0;
    local_2d8.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_2d8,&local_1b0,&p_work[iVar6].m_backend);
    pcVar15 = &local_2d8;
    puVar17 = (uint *)(piVar20 + -0x3f);
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      *puVar17 = (pcVar15->data)._M_elems[0];
      pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar21 * -8 + 4);
      puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
    }
    piVar20[-0x23] = local_2d8.exp;
    *(bool *)(piVar20 + -0x22) = local_2d8.neg;
    *(undefined8 *)(piVar20 + -0x21) = local_2d8._120_8_;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&p_work[iVar6].m_backend,0.0);
    piVar20 = piVar20 + 0x20;
    lVar13 = lVar13 + 0x100000000;
    lVar11 = lVar11 + 1;
  }
  *(int *)((long)local_250 + (lVar13 >> 0x1e)) = p_col;
  local_2d8.fpclass = cpp_dec_float_finite;
  local_2d8.prec_elem = 0x1c;
  local_2d8.data._M_elems[0] = 0;
  local_2d8.data._M_elems[1] = 0;
  local_2d8.data._M_elems[2] = 0;
  local_2d8.data._M_elems[3] = 0;
  local_2d8.data._M_elems[4] = 0;
  local_2d8.data._M_elems[5] = 0;
  local_2d8.data._M_elems[6] = 0;
  local_2d8.data._M_elems[7] = 0;
  local_2d8.data._M_elems[8] = 0;
  local_2d8.data._M_elems[9] = 0;
  local_2d8.data._M_elems[10] = 0;
  local_2d8.data._M_elems[0xb] = 0;
  local_2d8.data._M_elems[0xc] = 0;
  local_2d8.data._M_elems[0xd] = 0;
  local_2d8.data._M_elems[0xe] = 0;
  local_2d8.data._M_elems[0xf] = 0;
  local_2d8.data._M_elems[0x18] = 0;
  local_2d8.data._M_elems[0x19] = 0;
  local_2d8.data._M_elems._104_5_ = 0;
  local_2d8.data._M_elems[0x1b]._1_3_ = 0;
  local_2d8.exp = 0;
  local_2d8.neg = false;
  local_2d8.data._M_elems[0x10] = 0;
  local_2d8.data._M_elems[0x11] = 0;
  local_2d8.data._M_elems[0x12] = 0;
  local_2d8.data._M_elems[0x13] = 0;
  local_2d8.data._M_elems[0x14] = 0;
  local_2d8.data._M_elems[0x15] = 0;
  local_2d8.data._M_elems[0x16] = 0;
  local_2d8.data._M_elems[0x17] = 0;
  local_230[0] = 1;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
            (&local_2d8,local_230,&local_1b0);
  lVar13 = lVar13 >> 0x19;
  pcVar15 = &local_2d8;
  puVar17 = (uint *)((long)(local_258->m_backend).data._M_elems + lVar13);
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar17 = (pcVar15->data)._M_elems[0];
    pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar21 * -8 + 4);
    puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
  }
  *(int *)((long)(&(local_258->m_backend).data + 1) + lVar13) = local_2d8.exp;
  *(bool *)((long)(&(local_258->m_backend).data + 1) + 4U + lVar13) = local_2d8.neg;
  *(undefined8 *)((long)(&(local_258->m_backend).data + 1) + 8U + lVar13) = local_2d8._120_8_;
  piVar10 = (int *)((long)piVar10 + (lVar12 * 4 - lVar8));
  for (uVar7 = (num - (int)lVar11) - 2; -1 < (int)uVar7; uVar7 = uVar7 - 1) {
    iVar6 = local_240[uVar7];
    *piVar10 = iVar6;
    local_2d8.fpclass = cpp_dec_float_finite;
    local_2d8.prec_elem = 0x1c;
    local_2d8.data._M_elems[0] = 0;
    local_2d8.data._M_elems[1] = 0;
    local_2d8.data._M_elems[2] = 0;
    local_2d8.data._M_elems[3] = 0;
    local_2d8.data._M_elems[4] = 0;
    local_2d8.data._M_elems[5] = 0;
    local_2d8.data._M_elems[6] = 0;
    local_2d8.data._M_elems[7] = 0;
    local_2d8.data._M_elems[8] = 0;
    local_2d8.data._M_elems[9] = 0;
    local_2d8.data._M_elems[10] = 0;
    local_2d8.data._M_elems[0xb] = 0;
    local_2d8.data._M_elems[0xc] = 0;
    local_2d8.data._M_elems[0xd] = 0;
    local_2d8.data._M_elems[0xe] = 0;
    local_2d8.data._M_elems[0xf] = 0;
    local_2d8.data._M_elems[0x10] = 0;
    local_2d8.data._M_elems[0x11] = 0;
    local_2d8.data._M_elems[0x12] = 0;
    local_2d8.data._M_elems[0x13] = 0;
    local_2d8.data._M_elems[0x14] = 0;
    local_2d8.data._M_elems[0x15] = 0;
    local_2d8.data._M_elems[0x16] = 0;
    local_2d8.data._M_elems[0x17] = 0;
    local_2d8.data._M_elems[0x18] = 0;
    local_2d8.data._M_elems[0x19] = 0;
    local_2d8.data._M_elems._104_5_ = 0;
    local_2d8.data._M_elems[0x1b]._1_3_ = 0;
    local_2d8.exp = 0;
    local_2d8.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_2d8,&local_1b0,&p_work[iVar6].m_backend);
    bVar2 = local_2d8.neg;
    iVar1 = local_2d8.exp;
    pcVar15 = &local_2d8;
    puVar17 = (uint *)(local_230 + 1);
    for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar17 = (pcVar15->data)._M_elems[0];
      pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar21 * -8 + 4);
      puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
    }
    fVar3 = local_2d8.fpclass;
    iVar4 = local_2d8.prec_elem;
    memmove((cpp_dec_float<200U,_int,_void> *)(piVar20 + -0x1f),&local_2d8,0x70);
    piVar20[-3] = iVar1;
    *(bool *)(piVar20 + -2) = bVar2;
    piVar20[-1] = fVar3;
    *piVar20 = iVar4;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&p_work[iVar6].m_backend,0.0);
    plVar14 = local_230 + 1;
    pmVar18 = local_b0;
    for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
      *(int *)pmVar18 = (int)*plVar14;
      plVar14 = (longlong *)((long)plVar14 + ((ulong)bVar21 * -2 + 1) * 4);
      pmVar18 = pmVar18 + (ulong)bVar21 * -8 + 4;
    }
    local_40 = iVar1;
    local_3c = bVar2;
    local_38 = fVar3;
    local_34 = iVar4;
    boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((type *)&local_2d8,local_b0,arg);
    tVar5 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_2d8,&this->maxabs);
    if (tVar5) {
      lVar8 = 0x1c;
      plVar14 = local_230 + 1;
      pmVar18 = local_130;
      for (lVar11 = lVar8; lVar11 != 0; lVar11 = lVar11 + -1) {
        *(int *)pmVar18 = (int)*plVar14;
        plVar14 = (longlong *)((long)plVar14 + ((ulong)bVar21 * -2 + 1) * 4);
        pmVar18 = pmVar18 + (ulong)bVar21 * -8 + 4;
      }
      local_c0 = iVar1;
      local_bc = bVar2;
      local_b8 = fVar3;
      local_b4 = iVar4;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((type *)&local_2d8,local_130,arg_00);
      pcVar15 = &local_2d8;
      pnVar19 = &this->maxabs;
      for (; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pnVar19->m_backend).data._M_elems[0] =
             (((cpp_dec_float<200U,_int,_void> *)&pcVar15->data)->data)._M_elems[0];
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + ((ulong)bVar21 * -2 + 1) * 4);
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + (ulong)bVar21 * -8 + 4);
      }
      (this->maxabs).m_backend.exp = local_2d8.exp;
      (this->maxabs).m_backend.neg = local_2d8.neg;
      (this->maxabs).m_backend.fpclass = local_2d8.fpclass;
      (this->maxabs).m_backend.prec_elem = local_2d8.prec_elem;
    }
    piVar10 = piVar10 + 1;
    piVar20 = piVar20 + 0x20;
  }
  this->stat = OK;
  return;
}

Assistant:

void CLUFactor<R>::update(int p_col, R* p_work, const int* p_idx, int num)
{
   int ll, i, j;
   int* lidx;
   R* lval;
   R x, rezi;

   assert(p_work[p_col] != 0.0);
   rezi = 1 / p_work[p_col];
   p_work[p_col] = 0.0;

   ll = makeLvec(num, p_col);
   //   ll = fac->makeLvec(num, col);
   lval = l.val.data();
   lidx = l.idx;

   for(i = num - 1; (j = p_idx[i]) != p_col; --i)
   {
      lidx[ll] = j;
      lval[ll] = rezi * p_work[j];
      p_work[j] = 0.0;
      ++ll;
   }

   lidx[ll] = p_col;

   lval[ll] = 1 - rezi;
   ++ll;

   for(--i; i >= 0; --i)
   {
      j = p_idx[i];
      lidx[ll] = j;
      lval[ll] = x = rezi * p_work[j];
      p_work[j] = 0.0;
      ++ll;

      if(spxAbs(x) > maxabs)
         maxabs = spxAbs(x);
   }

   this->stat = SLinSolver<R>::OK;
}